

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

bool polyscope::view::viewIsValid(void)

{
  bool bVar1;
  col_type *this;
  float *pfVar2;
  int j;
  int i;
  bool allFinite;
  int local_c;
  int local_8;
  bool local_1;
  
  local_1 = true;
  for (local_8 = 0; local_8 < 4; local_8 = local_8 + 1) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      this = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)viewMat,local_8);
      pfVar2 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](this,local_c);
      bVar1 = std::isfinite(*pfVar2);
      if (!bVar1) {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool viewIsValid() {
  bool allFinite = true;
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      if (!std::isfinite(viewMat[i][j])) {
        allFinite = false;
      }
    }
  }
  return allFinite;
}